

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_>
getMessageUniquePtr(HelicsMessage message,HelicsError *err)

{
  bool bVar1;
  Message *pMVar2;
  HelicsError *in_RDX;
  Message *in_RDI;
  MessageHolder *messages;
  Message *mess;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *ptr;
  nullptr_t in_stack_ffffffffffffffa8;
  _Head_base<0UL,_helics::Message_*,_false> _Var3;
  int in_stack_ffffffffffffffc4;
  MessageHolder *in_stack_ffffffffffffffc8;
  
  _Var3._M_head_impl = in_RDI;
  pMVar2 = getMessageObj(in_RDI,(HelicsError *)in_RDI);
  if (pMVar2 == (Message *)0x0) {
    std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
    unique_ptr<std::default_delete<helics::Message>,void>
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI,
               in_stack_ffffffffffffffa8);
  }
  else if (pMVar2->backReference == (void *)0x0) {
    assignError(in_RDX,-4,"the message is NULL");
    std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
    unique_ptr<std::default_delete<helics::Message>,void>
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI,
               in_stack_ffffffffffffffa8);
  }
  else {
    helics::MessageHolder::extractMessage(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       0x1defd1);
    if (!bVar1) {
      assignError(in_RDX,-4,"the message is NULL");
    }
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)_Var3._M_head_impl;
}

Assistant:

std::unique_ptr<helics::Message> getMessageUniquePtr(HelicsMessage message, HelicsError* err)
{
    static constexpr char invalidLocationString[] = "the message is NULL";
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return nullptr;
    }
    auto* messages = reinterpret_cast<helics::MessageHolder*>(mess->backReference);
    if (messages != nullptr) {
        auto ptr = messages->extractMessage(mess->counter);
        if (!ptr) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidLocationString);
        }
        return ptr;
    }
    assignError(err, HELICS_ERROR_INVALID_ARGUMENT, emptyMessageErrorString);
    return nullptr;
}